

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed_change.c
# Opt level: O0

int speed_segment_mix(mixed_segment *segment)

{
  int error;
  char *pcVar1;
  undefined4 in_stack_ffffffffffffff90;
  undefined4 in_stack_ffffffffffffff94;
  uint32_t local_68;
  int e;
  uint32_t out;
  uint32_t in;
  SRC_DATA src_data;
  speed_segment_data *data;
  mixed_segment *segment_local;
  
  src_data.src_ratio = (double)segment->data;
  memset(&out,0,0x40);
  e = -1;
  local_68 = 0xffffffff;
  mixed_buffer_request_read((float **)&out,(uint32_t *)&e,*(mixed_buffer **)src_data.src_ratio);
  mixed_buffer_request_write
            (&src_data.data_in,&local_68,*(mixed_buffer **)((long)src_data.src_ratio + 8));
  src_data._48_8_ = 1.0 / *(double *)((long)src_data.src_ratio + 0x18);
  src_data.data_out = (float *)(ulong)(uint)e;
  src_data.input_frames = (long)local_68;
  if ((src_data.data_out == (float *)0x0) || (src_data.input_frames == 0)) {
    mixed_buffer_finish_write(0,*(mixed_buffer **)((long)src_data.src_ratio + 8));
  }
  else {
    error = src_process((SRC_STATE *)CONCAT44(e,local_68),
                        (SRC_DATA *)CONCAT44(in_stack_ffffffffffffff94,in_stack_ffffffffffffff90));
    if (error != 0) {
      pcVar1 = src_strerror(error);
      printf("%s\n",pcVar1);
      mixed_err(0xf);
      return 0;
    }
    mixed_buffer_finish_read((uint32_t)src_data.output_frames,*(mixed_buffer **)src_data.src_ratio);
    mixed_buffer_finish_write
              ((uint32_t)src_data.input_frames_used,*(mixed_buffer **)((long)src_data.src_ratio + 8)
              );
  }
  return 1;
}

Assistant:

int speed_segment_mix(struct mixed_segment *segment){
  struct speed_segment_data *data = (struct speed_segment_data *)segment->data;
  SRC_DATA src_data = {0};
  uint32_t in = UINT32_MAX, out = UINT32_MAX;
  mixed_buffer_request_read((float **)&src_data.data_in, &in, data->in);
  mixed_buffer_request_write(&src_data.data_out, &out, data->out);
  src_data.src_ratio = 1.0 / data->speed;
  src_data.input_frames = in;
  src_data.output_frames = out;
  if(src_data.input_frames && src_data.output_frames){
    int e = src_process(data->resample_state, &src_data);
    if(e){
      printf("%s\n", src_strerror(e));
      mixed_err(MIXED_RESAMPLE_FAILED);
      return 0;
    }
    mixed_buffer_finish_read(src_data.input_frames_used, data->in);
    mixed_buffer_finish_write(src_data.output_frames_gen, data->out);
  }else{
    mixed_buffer_finish_write(0, data->out);
  }
  return 1;
}